

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloc-aligned.c
# Opt level: O0

void * mi_recalloc_aligned_at(void *p,size_t newcount,size_t size,size_t alignment,size_t offset)

{
  void *pvVar1;
  size_t in_RCX;
  size_t in_RDX;
  size_t in_RSI;
  size_t in_RDI;
  
  mi_prim_get_default_heap();
  pvVar1 = mi_heap_recalloc_aligned_at
                     ((mi_heap_t *)alignment,(void *)offset,in_RDI,in_RSI,in_RDX,in_RCX);
  return pvVar1;
}

Assistant:

mi_decl_nodiscard void* mi_recalloc_aligned_at(void* p, size_t newcount, size_t size, size_t alignment, size_t offset) mi_attr_noexcept {
  return mi_heap_recalloc_aligned_at(mi_prim_get_default_heap(), p, newcount, size, alignment, offset);
}